

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O1

expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
* __thiscall
jaegertracing::Tracer::Extract
          (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
           *__return_storage_ptr__,Tracer *this,istream *reader)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  SpanContext *this_00;
  SpanContext spanContext;
  SpanContext local_1d0;
  SpanContext local_100;
  
  propagation::BinaryPropagator::extract(&local_100,&this->_binaryPropagator,reader);
  local_1d0._baggage._M_h._M_buckets = &local_1d0._baggage._M_h._M_single_bucket;
  local_1d0.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00274328;
  local_1d0._traceID._high = 0;
  local_1d0._traceID._low = 0;
  local_1d0._spanID = 0;
  local_1d0._parentID = 0;
  local_1d0._flags = '\0';
  local_1d0._baggage._M_h._M_bucket_count = 1;
  local_1d0._baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1d0._baggage._M_h._M_element_count = 0;
  local_1d0._baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_1d0._baggage._M_h._M_rehash_policy._M_next_resize = 0;
  local_1d0._baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
  paVar1 = &local_1d0._debugID.field_2;
  local_1d0._debugID._M_string_length = 0;
  local_1d0._debugID.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_1d0._traceState.field_2;
  local_1d0._traceState._M_string_length = 0;
  local_1d0._traceState.field_2._M_local_buf[0] = '\0';
  local_1d0._mutex.super___mutex_base._M_mutex.__align = 0;
  local_1d0._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  local_1d0._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  local_1d0._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  local_1d0._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  local_1d0._debugID._M_dataplus._M_p = (pointer)paVar1;
  local_1d0._traceState._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = operator==(&local_100,&local_1d0);
  local_1d0.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00274328;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._traceState._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0._traceState._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._debugID._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._debugID._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1d0._baggage._M_h);
  if (bVar3) {
    __return_storage_ptr__->has_value_ = true;
    (__return_storage_ptr__->contained).m_value._M_t.
    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
    ._M_t.
    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl = (SpanContext *)0x0;
  }
  else {
    this_00 = (SpanContext *)operator_new(0xd0);
    SpanContext::SpanContext(this_00,&local_100);
    __return_storage_ptr__->has_value_ = true;
    *(SpanContext **)&__return_storage_ptr__->contained = this_00;
  }
  local_100.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00274328;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._traceState._M_dataplus._M_p != &local_100._traceState.field_2) {
    operator_delete(local_100._traceState._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._debugID._M_dataplus._M_p != &local_100._debugID.field_2) {
    operator_delete(local_100._debugID._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_100._baggage._M_h);
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<std::unique_ptr<opentracing::SpanContext>>
    Extract(std::istream& reader) const override
    {
        const auto spanContext = _binaryPropagator.extract(reader);
        if (spanContext == SpanContext()) {
            return std::unique_ptr<opentracing::SpanContext>();
        }
        return std::unique_ptr<opentracing::SpanContext>(
            new SpanContext(spanContext));
    }